

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dukvalue.h
# Opt level: O0

void __thiscall DukValue::push(DukValue *this)

{
  duk_context *ctx_00;
  duk_size_t len;
  DukException *this_00;
  DukException *pDVar1;
  char *pcVar2;
  DukException local_48;
  duk_context *local_18;
  duk_context *ctx;
  DukValue *this_local;
  
  ctx_00 = this->mContext;
  local_18 = ctx_00;
  ctx = (duk_context *)this;
  switch(this->mType) {
  case UNDEFINED:
    duk_push_undefined(ctx_00);
    break;
  case NULLREF:
    duk_push_null(ctx_00);
    break;
  case BOOLEAN:
    duk_push_boolean(ctx_00,(uint)((this->mPOD).boolean & 1));
    break;
  case NUMBER:
    duk_push_number(ctx_00,(this->mPOD).number);
    break;
  case STRING:
    pcVar2 = (char *)std::__cxx11::string::data();
    len = std::__cxx11::string::size();
    duk_push_lstring(ctx_00,pcVar2,len);
    break;
  case OBJECT:
    push_ref_array(ctx_00);
    duk_get_prop_index(local_18,-1,(this->mPOD).ref_array_idx);
    duk_remove(local_18,-2);
    break;
  case BUFFER:
  case LIGHTFUNC:
  default:
    this_00 = (DukException *)__cxa_allocate_exception(0x28);
    local_48.mMsg._M_string_length = 0;
    local_48.mMsg.field_2._M_allocated_capacity = 0;
    local_48.super_exception = (exception)0x0;
    local_48._1_7_ = 0;
    local_48.mMsg._M_dataplus = (_Alloc_hider)0x0;
    local_48.mMsg._1_7_ = 0;
    local_48.mMsg.field_2._8_8_ = 0;
    DukException::DukException(&local_48);
    pDVar1 = DukException::operator<<(&local_48,"DukValue.push() not implemented for type (");
    pcVar2 = type_name(this);
    pDVar1 = DukException::operator<<(pDVar1,pcVar2);
    pDVar1 = DukException::operator<<(pDVar1,")");
    DukException::DukException(this_00,pDVar1);
    __cxa_throw(this_00,&DukException::typeinfo,DukException::~DukException);
  case POINTER:
    duk_push_pointer(ctx_00,(this->mPOD).pointer);
  }
  return;
}

Assistant:

inline void push() const {
		duk_context* ctx = mContext;

		switch (mType) {
		case UNDEFINED:
			duk_push_undefined(ctx);
			break;
		case NULLREF:
			duk_push_null(ctx);
			break;

		case BOOLEAN:
			duk_push_boolean(ctx, mPOD.boolean);
			break;

		case NUMBER:
			duk_push_number(ctx, mPOD.number);
			break;

		case STRING:
			duk_push_lstring(ctx, mString.data(), mString.size());
			break;

		case OBJECT:
			push_ref_array(ctx);
			duk_get_prop_index(ctx, -1, mPOD.ref_array_idx);
			duk_remove(ctx, -2);
			break;

		case POINTER:
			duk_push_pointer(ctx, mPOD.pointer);
			break;

		case BUFFER:
		case LIGHTFUNC:
		default:
			throw DukException() << "DukValue.push() not implemented for type (" << type_name() << ")";
		}
	}